

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjasm.cpp
# Opt level: O2

void __thiscall
Options::COptionsParser::GetOptions(COptionsParser *this,char **argv,int *i,bool onlySyntaxOptions)

{
  char *v1;
  char *__args;
  char cVar1;
  char cVar2;
  long lVar3;
  int iVar4;
  byte bVar5;
  int iVar6;
  char *pcVar7;
  char *message;
  char defV [2048];
  char defN [2048];
  
  v1 = this->opt;
  __args = this->val;
  iVar4 = *i;
  do {
    pcVar7 = argv[iVar4];
    this->arg = pcVar7;
    if ((pcVar7 == (char *)0x0) || (*pcVar7 != '-')) {
      return;
    }
    cVar1 = pcVar7[1];
    if (cVar1 == '-') {
      splitByChar(pcVar7 + 2,0x3d,v1,0x800,__args,0x800);
    }
    else {
      this->opt[0] = cVar1;
      this->opt[1] = '\0';
      if (cVar1 != '\0') {
        strcpy(__args,pcVar7 + 2);
      }
    }
    iVar4 = bcmp(v1,"zxnext",7);
    if (iVar4 == 0) {
      if (IsI8080 == '\x01') {
        Error("Can\'t enable Next extensions while in i8080 mode",(char *)0x0,FATAL);
      }
      if (IsLR35902 == '\x01') {
        Error("Can\'t enable Next extensions while in Sharp LR35902 mode",(char *)0x0,FATAL);
      }
      iVar4 = bcmp(__args,"cspect",7);
      DAT_0018a51c = (iVar4 == 0) + 1;
    }
    else {
      iVar4 = bcmp(v1,"reversepop",0xb);
      if (iVar4 == 0) {
        DAT_0018a509 = 1;
      }
      else {
        iVar4 = bcmp(v1,"dirbol",7);
        if (iVar4 == 0) {
          syx = 1;
        }
        else {
          lVar3 = *(long *)v1;
          if (lVar3 == 0x73656b61666f6e) {
            DAT_0018a50a = 0;
          }
          else {
            iVar4 = bcmp(v1,"syntax",7);
            if (iVar4 == 0) {
              parseSyntaxValue(this);
            }
            else if ((char)lVar3 == 'W' && cVar1 != '-') {
              CliWoption(__args);
            }
            else {
              if (onlySyntaxOptions) {
                return;
              }
              if (lVar3 == 0x3230393533726c) {
                IsLR35902 = '\x01';
                IsI8080 = '\0';
              }
              else {
                iVar4 = bcmp(v1,"i8080",6);
                if (iVar4 != 0) {
                  cVar2 = *__args;
                  if (((char)lVar3 == 'h' && cVar1 != '-') && cVar2 == '\0') {
LAB_00123d03:
                    iVar4 = bcmp("warnings",__args,9);
                    ShowHelp = ShowHelp | iVar4 != 0;
                    ShowHelpWarnings = ShowHelpWarnings | iVar4 == 0;
                  }
                  else {
                    if (cVar1 == '-') {
                      iVar4 = bcmp(v1,"help",5);
                      if (iVar4 == 0) goto LAB_00123d03;
                      if (lVar3 == 0x6e6f6973726576) {
                        ShowVersion = 1;
                        goto LAB_00123d40;
                      }
                    }
                    iVar4 = bcmp(v1,"lstlab",7);
                    if (iVar4 == 0) {
                      AddLabelListing = 1;
                      if (cVar2 != '\0') {
                        iVar4 = bcmp("sort",__args,5);
                        SortSymbols = iVar4 == 0;
                      }
                    }
                    else if (lVar3 == 0x727470676e6f6c) {
                      IsLongPtr = 1;
                    }
                    else {
                      iVar4 = (int)lVar3;
                      if (iVar4 == 0x67736d) {
                        iVar4 = bcmp("none",__args,5);
                        if (iVar4 == 0) {
                          OutputVerbosity = 3;
LAB_0012405e:
                          HideLogo = 1;
                        }
                        else {
                          iVar4 = *(int *)__args;
                          if (iVar4 == 0x6c6c61) {
                            OutputVerbosity = 0;
                          }
                          else if (iVar4 == 0x726177) {
                            OutputVerbosity = 1;
                          }
                          else {
                            if (iVar4 == 0x74736c) {
                              OutputVerbosity = 4;
                              AddLabelListing = 0;
                              goto LAB_0012405e;
                            }
                            if (iVar4 == 0x727265) {
                              OutputVerbosity = 2;
                            }
                            else {
                              iVar4 = bcmp("lstlab",__args,7);
                              if (iVar4 != 0) {
                                message = "unexpected parameter in";
                                pcVar7 = this->arg;
                                goto LAB_00124097;
                              }
                              OutputVerbosity = 4;
                              AddLabelListing = 1;
                              SortSymbols = 1;
                              HideLogo = 1;
                            }
                          }
                        }
                      }
                      else if (iVar4 == 0x74736c && cVar2 == '\0') {
                        IsDefaultListingName = 1;
                      }
                      else if (iVar4 == 0x646c73 && cVar2 == '\0') {
                        IsDefaultSldName = 1;
                      }
                      else {
                        iVar4 = CheckAssignmentOption(this,"outprefix",(path *)OutPrefix_abi_cxx11_)
                        ;
                        if (((((iVar4 == 0) &&
                              (iVar4 = CheckAssignmentOption
                                                 (this,"sym",(path *)SymbolListFName_abi_cxx11_),
                              iVar4 == 0)) &&
                             (iVar4 = CheckAssignmentOption
                                                (this,"lst",(path *)ListingFName_abi_cxx11_),
                             iVar4 == 0)) &&
                            ((iVar4 = CheckAssignmentOption
                                                (this,"exp",(path *)ExportFName_abi_cxx11_),
                             iVar4 == 0 &&
                             (iVar4 = CheckAssignmentOption
                                                (this,"sld",(path *)SourceLevelDebugFName_abi_cxx11_
                                                ), iVar4 == 0)))) &&
                           (iVar4 = CheckAssignmentOption(this,"raw",(path *)RAWFName_abi_cxx11_),
                           iVar4 == 0)) {
                          iVar4 = bcmp(v1,"fullpath",9);
                          pcVar7 = __args;
                          if (iVar4 == 0) {
                            iVar4 = bcmp("on",__args,3);
                            if (iVar4 == 0) {
                              FileVerbosity = 2;
                            }
                            else if (*(int *)__args == 0x6c6572 || *__args == '\0') {
                              FileVerbosity = 1;
                            }
                            else {
                              if (*(int *)__args != 0x66666f) {
                                message = "invalid --fullpath setting (use: on|rel|off)";
                                goto LAB_00124097;
                              }
                              FileVerbosity = 0;
                            }
                          }
                          else {
                            iVar4 = bcmp(v1,"color",6);
                            if (iVar4 == 0) {
                              iVar4 = bcmp("on",__args,3);
                              if (iVar4 == 0) {
                                tcols = tcols_ansi;
                              }
                              else if (*(int *)__args == 0x66666f) {
                                tcols = (undefined *)&tcols_none;
                              }
                              else {
                                iVar4 = bcmp("auto",__args,5);
                                if (iVar4 != 0) {
                                  message = "invalid --color setting (use: on|off|auto)";
                                  goto LAB_00124097;
                                }
                              }
                            }
                            else {
                              iVar4 = bcmp(v1,"nologo",7);
                              if (iVar4 == 0) goto LAB_0012405e;
                              iVar4 = bcmp(v1,"dos866",7);
                              if (iVar4 == 0) {
                                ConvertEncoding = 0;
                              }
                              else if ((cVar1 == '-' && *(int *)v1 == 0x636e69) ||
                                      (bVar5 = (byte)*(int *)v1,
                                      (bVar5 & 0xdf) == 0x49 && cVar1 != '-')) {
                                if (*__args == '\0') {
                                  if ((cVar1 == '-') && (this->arg[5] != '=')) {
                                    std::
                                    vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                                    ::clear((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                                             *)&IncludeDirsList_abi_cxx11_);
                                  }
                                  else {
                                    iVar4 = *i;
                                    if ((argv[(long)iVar4 + 1] == (char *)0x0) ||
                                       (*argv[(long)iVar4 + 1] == '-')) {
                                      message = "no include path found for";
                                      pcVar7 = this->arg;
                                      goto LAB_00124097;
                                    }
                                    *i = iVar4 + 1;
                                    std::
                                    vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
                                    ::emplace_back<char_const*const&>
                                              ((vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
                                                *)&IncludeDirsList_abi_cxx11_,argv + (long)iVar4 + 1
                                              );
                                  }
                                }
                                else {
                                  std::
                                  vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
                                  ::emplace_back<char(&)[2048]>
                                            ((vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
                                              *)&IncludeDirsList_abi_cxx11_,(char (*) [2048])__args)
                                  ;
                                }
                              }
                              else {
                                iVar6 = 0x15590d;
                                iVar4 = bcmp(v1,"define",7);
                                if (iVar4 == 0) {
                                  pcVar7 = argv[(long)*i + 1];
                                  if (pcVar7 == (char *)0x0) {
                                    memset(defN,0,0x800);
                                    memset(defV,0,0x800);
                                  }
                                  else {
                                    *i = *i + 1;
                                    memset(defN,0,0x800);
                                    memset(defV,0,0x800);
                                    splitByChar(pcVar7,0x3d,defN,0x800,defV,0x800);
                                    if (defN[0] != '\0') goto LAB_001242e2;
                                  }
                                  message = "missing define value";
LAB_00124097:
                                  Error(message,pcVar7,ALL);
                                }
                                else if (bVar5 == 0x44 && cVar1 != '-') {
                                  if (*__args == '\0') {
                                    message = "no parameters found in";
                                    pcVar7 = this->arg;
                                    goto LAB_00124097;
                                  }
                                  splitByChar(__args,0x3d,defN,0x800,defV,0x800);
LAB_001242e2:
                                  CDefineTable::Add((CDefineTable *)CmdDefineTable,defN,defV,
                                                    (CStringsList *)0x0);
                                }
                                else {
                                  if (bVar5 != 0 || cVar1 == '-') {
                                    message = "unrecognized option";
                                    pcVar7 = this->arg;
                                    goto LAB_00124097;
                                  }
                                  SSource::SSource((SSource *)defN,iVar6);
                                  std::vector<SSource,_std::allocator<SSource>_>::
                                  emplace_back<SSource>(&sourceFiles,(SSource *)defN);
                                  SSource::~SSource((SSource *)defN);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  goto LAB_00123d40;
                }
                IsI8080 = '\x01';
                IsLR35902 = '\0';
              }
              DAT_0018a51c = 0;
            }
          }
        }
      }
    }
LAB_00123d40:
    iVar4 = *i + 1;
    *i = iVar4;
  } while( true );
}

Assistant:

void GetOptions(const char* const * const argv, int& i, bool onlySyntaxOptions = false) {
			while ((arg=argv[i]) && ('-' == arg[0])) {
				bool doubleDash = false;
				// copy "option" (up to '=' char) into `opt`, copy "value" (after '=') into `val`
				if ('-' == arg[1]) {	// double-dash detected, value is expected after "="
					doubleDash = true;
					splitByChar(arg + 2, '=', opt, LINEMAX, val, LINEMAX);
				} else {				// single dash, parse value from second character onward
					opt[0] = arg[1];	// copy only single letter into `opt`
					opt[1] = 0;
					if (opt[0]) {		// if it was not empty, try to copy also `val`
						STRCPY(val, LINEMAX, arg + 2);
					}
				}

				// check for particular options and setup option value by it
				// first check all syntax-only options which may be modified by OPT directive
				if (!strcmp(opt, "zxnext")) {
					if (IsI8080) Error("Can't enable Next extensions while in i8080 mode", nullptr, FATAL);
					if (IsLR35902) Error("Can't enable Next extensions while in Sharp LR35902 mode", nullptr, FATAL);
					syx.IsNextEnabled = 1;
					if (!strcmp(val, "cspect")) syx.IsNextEnabled = 2;	// CSpect emulator extensions
				} else if (!strcmp(opt, "reversepop")) {
					syx.IsReversePOP = true;
				} else if (!strcmp(opt, "dirbol")) {
					syx.IsPseudoOpBOF = true;
				} else if (!strcmp(opt, "nofakes")) {
					syx.FakeEnabled = false;
					// was deprecated, as it is provided by `--syntax=F` too, but now I decided to keep also this older option
					// (it's less cryptic than the --syntax letter soup, one duplicity of functionality will not end the world, right?)
				} else if (!strcmp(opt, "syntax")) {
					parseSyntaxValue();
				} else if (!doubleDash && 'W' == opt[0]) {
					CliWoption(val);
				} else if (onlySyntaxOptions) {
					// rest of the options is available only when launching the sjasmplus
					return;
				} else if (!strcmp(opt, "lr35902")) {
					IsLR35902 = true;
					// force (silently) other CPU modes OFF
					IsI8080 = false;
					syx.IsNextEnabled = 0;
				} else if (!strcmp(opt, "i8080")) {
					IsI8080 = true;
					// force (silently) other CPU modes OFF
					IsLR35902 = false;
					syx.IsNextEnabled = 0;
				} else if ((!doubleDash && 'h' == opt[0] && !val[0]) || (doubleDash && !strcmp(opt, "help"))) {
					ShowHelp |= !!strcmp("warnings", val);
					ShowHelpWarnings |= !strcmp("warnings", val);
				} else if (doubleDash && !strcmp(opt, "version")) {
					ShowVersion = true;
				} else if (!strcmp(opt, "lstlab")) {
					AddLabelListing = true;
					if (val[0]) SortSymbols = !strcmp("sort", val);
				} else if (!strcmp(opt, "longptr")) {
					IsLongPtr = true;
				} else if (!strcmp(opt, "msg")) {
					if (!strcmp("none", val)) {
						OutputVerbosity = OV_NONE;
						HideLogo = true;
					} else if (!strcmp("err", val)) {
						OutputVerbosity = OV_ERROR;
					} else if (!strcmp("war", val)) {
						OutputVerbosity = OV_WARNING;
					} else if (!strcmp("all", val)) {
						OutputVerbosity = OV_ALL;
					} else if (!strcmp("lst", val)) {
						OutputVerbosity = OV_LST;
						AddLabelListing = false;
						HideLogo = true;
					} else if (!strcmp("lstlab", val)) {
						OutputVerbosity = OV_LST;
						AddLabelListing = true;
						SortSymbols = true;
						HideLogo = true;
					} else {
						Error("unexpected parameter in", arg, ALL);
					}
				} else if (!strcmp(opt, "lst") && !val[0]) {
					IsDefaultListingName = true;
				} else if (!strcmp(opt, "sld") && !val[0]) {
					IsDefaultSldName = true;
				} else if (
					CheckAssignmentOption("outprefix", OutPrefix) ||
					CheckAssignmentOption("sym", SymbolListFName) ||
					CheckAssignmentOption("lst", ListingFName) ||
					CheckAssignmentOption("exp", ExportFName) ||
					CheckAssignmentOption("sld", SourceLevelDebugFName) ||
					CheckAssignmentOption("raw", RAWFName) ) {
					// was proccessed inside CheckAssignmentOption function
				} else if (!strcmp(opt, "fullpath")) {
					if (!strcmp("on", val)) {
						FileVerbosity = FNAME_ABSOLUTE;
					} else if (!val[0] || !strcmp("rel", val)) {
						FileVerbosity = FNAME_LAUNCH_REL;
					} else if (!strcmp("off", val)) {
						FileVerbosity = FNAME_BASE;
					} else {
						Error("invalid --fullpath setting (use: on|rel|off)", val, ALL);
					}
				} else if (!strcmp(opt, "color")) {
					if (!strcmp("on", val)) {
						SetTerminalColors(true);
					} else if (!strcmp("off", val)) {
						SetTerminalColors(false);
					} else if (!strcmp("auto", val)) {
						// already heuristically detected, nothing to do
					} else {
						Error("invalid --color setting (use: on|off|auto)", val, ALL);
					}
				} else if (!strcmp(opt, "nologo")) {
					HideLogo = 1;
				} else if (!strcmp(opt, "dos866")) {
					ConvertEncoding = ENCDOS;
				} else if ((doubleDash && !strcmp(opt, "inc")) ||
							(!doubleDash && 'i' == opt[0]) ||
							(!doubleDash && 'I' == opt[0])) {
					if (*val) {
						IncludeDirsList.emplace_back(val);
					} else {
						if (!doubleDash || '=' == arg[5]) {
							if (argv[i+1] && '-' != argv[i+1][0]) {		// include path provided as next argument (after space, like gcc)
								IncludeDirsList.emplace_back(argv[++i]);
							} else {
								Error("no include path found for", arg, ALL);
							}
						} else {	// individual `--inc` without "= path" will RESET include dirs
							IncludeDirsList.clear();
						}
					}
				} else if (!strcmp(opt, "define")) {	// for --define name=value the next argv is used (if available)
					const char* defarg = argv[i+1] ? argv[++i] : nullptr;
					char defN[LINEMAX] {}, defV[LINEMAX] {};
					if (defarg) splitByChar(defarg, '=', defN, LINEMAX, defV, LINEMAX);
					if (*defN) CmdDefineTable.Add(defN, defV, nullptr);
					else Error("missing define value", defarg, ALL);
				} else if (!doubleDash && 'D' == opt[0]) {
					char defN[LINEMAX], defV[LINEMAX];
					if (*val) {		// for -Dname=value the `val` contains "name=value" string
						splitByChar(val, '=', defN, LINEMAX, defV, LINEMAX);
						CmdDefineTable.Add(defN, defV, NULL);
					} else {
						Error("no parameters found in", arg, ALL);
					}
				} else if (!doubleDash && 0 == opt[0]) {
					// only single "-" was on command line = source STDIN
					sourceFiles.push_back(SSource(1));		// special constructor for stdin input
				} else {
					Error("unrecognized option", arg, ALL);
				}

				++i;					// next CLI argument
			} // end of while ((arg=argv[i]) && ('-' == arg[0]))
		}